

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RecordSet.cpp
# Opt level: O0

void __thiscall KDIS::DATA_TYPE::RecordSet::Encode(RecordSet *this,KDataStream *stream)

{
  bool bVar1;
  KDataStream *pKVar2;
  reference puVar3;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_28;
  const_iterator citrEnd;
  const_iterator citr;
  KDataStream *stream_local;
  RecordSet *this_local;
  
  pKVar2 = KDataStream::operator<<(stream,this->m_ui32RecID);
  pKVar2 = KDataStream::operator<<(pKVar2,this->m_ui32RecSetSerialNum);
  pKVar2 = KDataStream::operator<<(pKVar2,this->m_ui16RecLen);
  KDataStream::operator<<(pKVar2,this->m_ui16RecCnt);
  citrEnd = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin(&this->m_vui8RecVals);
  local_28._M_current =
       (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                          (&this->m_vui8RecVals);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&citrEnd,&local_28);
    if (!bVar1) break;
    puVar3 = __gnu_cxx::
             __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
             ::operator*(&citrEnd);
    KDataStream::operator<<(stream,*puVar3);
    __gnu_cxx::
    __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::operator++(&citrEnd);
  }
  return;
}

Assistant:

void RecordSet::Encode( KDataStream & stream ) const
{
    stream << m_ui32RecID
           << m_ui32RecSetSerialNum
           << m_ui16RecLen
           << m_ui16RecCnt;

    vector<KUINT8>::const_iterator citr = m_vui8RecVals.begin();
    vector<KUINT8>::const_iterator citrEnd = m_vui8RecVals.end();

    for( ; citr != citrEnd; ++citr )
    {
        stream << *citr;
    }
}